

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O1

void __thiscall LLVMBC::StreamState::append(StreamState *this,CallInst *call,bool decl)

{
  TypeID TVar1;
  uint uVar2;
  uint uVar3;
  Type *in_RAX;
  Type *this_00;
  Function *this_01;
  String *ts_2;
  Value *value;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
  _Var4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
  _Var5;
  const_iterator cVar6;
  undefined7 in_register_00000011;
  Type *local_38;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_38 = (Type *)Value::get_tween_id((Value *)call);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1c9936,(unsigned_long *)&local_38);
  }
  else {
    local_38 = in_RAX;
    this_00 = Value::getType((Value *)call);
    TVar1 = Type::getTypeID(this_00);
    if (TVar1 != VoidTyID) {
      local_38 = (Type *)Value::get_tween_id((Value *)call);
      append<char_const(&)[2],unsigned_long,char_const(&)[4]>
                (this,(char (*) [2])0x1c9936,(unsigned_long *)&local_38,(char (*) [4])" = ");
    }
    local_38 = Value::getType((Value *)call);
    this_01 = CallInst::getCalledFunction(call);
    ts_2 = Function::getName_abi_cxx11_(this_01);
    append<char_const(&)[6],LLVMBC::Type*,char_const(&)[3],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2]>
              (this,(char (*) [6])"call ",&local_38,(char (*) [3])" @",ts_2,(char (*) [2])0x1c97df);
    uVar2 = Instruction::getNumOperands(&call->super_Instruction);
    if (uVar2 != 0) {
      uVar2 = 0;
      do {
        value = Instruction::getOperand(&call->super_Instruction,uVar2);
        append(this,value,false);
        uVar2 = uVar2 + 1;
        uVar3 = Instruction::getNumOperands(&call->super_Instruction);
        if (uVar2 < uVar3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
        }
        uVar3 = Instruction::getNumOperands(&call->super_Instruction);
      } while (uVar2 < uVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,")",1);
    _Var4._M_cur = (__node_type *)Instruction::metadata_begin_abi_cxx11_(&call->super_Instruction);
    _Var5._M_cur = (__node_type *)Instruction::metadata_end_abi_cxx11_(&call->super_Instruction);
    if (_Var4._M_cur != _Var5._M_cur) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," !",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,
                   (char *)((_Var4._M_cur)->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>_>
                           ._M_storage._M_storage.__align,
                   *(long *)((long)&((_Var4._M_cur)->
                                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>_>
                                    ._M_storage._M_storage + 8));
        append<char_const(&)[2],LLVMBC::MDNode*const&>
                  (this,(char (*) [2])0x1c97ea,
                   (MDNode **)
                   ((long)&((_Var4._M_cur)->
                           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>_>
                           ._M_storage._M_storage + 0x20));
        _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
        cVar6 = Instruction::metadata_end_abi_cxx11_(&call->super_Instruction);
      } while ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
                )_Var4._M_cur !=
               cVar6.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::MDNode_*>,_true>
               ._M_cur);
    }
  }
  return;
}

Assistant:

void StreamState::append(CallInst *call, bool decl)
{
	if (decl)
	{
		if (call->getType()->getTypeID() != Type::TypeID::VoidTyID)
			append("%", call->get_tween_id(), " = ");
		append("call ", call->getType(), " @", call->getCalledFunction()->getName(), "(");
		for (unsigned i = 0; i < call->getNumOperands(); i++)
		{
			append(call->getOperand(i));
			if (i + 1 < call->getNumOperands())
				append(", ");
		}
		append(")");

		for (auto itr = call->metadata_begin(); itr != call->metadata_end(); ++itr)
		{
			append(" !", itr->first, " ", itr->second);
		}
	}
	else
	{
		append("%", call->get_tween_id());
	}
}